

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  PmDeviceInfo *pPVar6;
  uint id;
  char *pcVar7;
  int iVar8;
  
  puts("Apparently this is a 64-bit machine.");
  if (argc < 2) {
    bVar2 = false;
    printf("Usage: test [-h] %s\nwhere %s\n%s\n%s\n%s\n",
           "[-l latency] [-r rate] [-d device] [-s dur] [-n]",
           "latency is in ms, rate is messages per second,","device is the PortMidi device number,",
           "dur is the length of the test in seconds, and",
           "-n means send timestamps in the past, -h means help.");
    bVar1 = false;
LAB_00102a9d:
    latency = get_number("Latency in ms: ");
  }
  else {
    bVar3 = true;
    iVar5 = 1;
    bVar2 = false;
    bVar1 = false;
    do {
      while( true ) {
        pcVar7 = argv[iVar5];
        iVar8 = iVar5;
        if ((*pcVar7 == '-') && ((pcVar7[1] != 'h' || (pcVar7[2] != '\0')))) break;
LAB_001029ad:
        printf("Usage: test [-h] %s\nwhere %s\n%s\n%s\n%s\n",
               "[-l latency] [-r rate] [-d device] [-s dur] [-n]",
               "latency is in ms, rate is messages per second,",
               "device is the PortMidi device number,",
               "dur is the length of the test in seconds, and",
               "-n means send timestamps in the past, -h means help.");
LAB_001029d2:
        iVar5 = iVar8 + 1;
        if (argc <= iVar5) {
          if (bVar3) goto LAB_00102a9d;
          goto LAB_00102aaf;
        }
      }
      if ((pcVar7[1] != 'l') || ((pcVar7[2] != '\0' || (argc <= iVar5 + 1)))) {
        if ((pcVar7[1] == 'r') && (pcVar7[2] == '\0')) {
          iVar8 = iVar5 + 1;
          msgrate = atoi(argv[(long)iVar5 + 1]);
          printf("Rate will be %d messages/second\n",(ulong)(uint)msgrate);
          bVar1 = true;
        }
        else if ((pcVar7[1] == 's') && (pcVar7[2] == '\0')) {
          iVar8 = iVar5 + 1;
          duration = atoi(argv[(long)iVar5 + 1]);
          printf("Duration will be %d seconds\n",(ulong)(uint)msgrate);
          bVar2 = true;
        }
        else {
          if ((pcVar7[1] != 'n') || (pcVar7[2] != '\0')) goto LAB_001029ad;
          puts("Sending expired timestamps (-n)");
          expired_timestamps = 1;
        }
        goto LAB_001029d2;
      }
      latency = atoi(argv[iVar5 + 1]);
      bVar3 = false;
      printf("Latency will be %ld\n",(long)latency);
      iVar5 = iVar5 + 2;
    } while (iVar5 < argc);
  }
LAB_00102aaf:
  if (!bVar1) {
    msgrate = get_number("Rate in messages per second: ");
  }
  if (!bVar2) {
    duration = get_number("Duration in seconds: ");
  }
  Pm_GetDefaultInputDeviceID();
  uVar4 = Pm_GetDefaultOutputDeviceID();
  iVar5 = Pm_CountDevices();
  if (0 < iVar5) {
    id = 0;
    do {
      pPVar6 = Pm_GetDeviceInfo(id);
      if (pPVar6->output != 0) {
        printf("%d: %s, %s",(ulong)id,pPVar6->interf,pPVar6->name);
        pcVar7 = "";
        if (uVar4 == id) {
          pcVar7 = "default ";
        }
        if (id == deviceno) {
          pcVar7 = "selected ";
        }
        printf(" (%soutput)",pcVar7);
        putchar(10);
      }
      id = id + 1;
      iVar5 = Pm_CountDevices();
    } while ((int)id < iVar5);
  }
  deviceno = get_number("Output device number: ");
  fast_test();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    int default_in;
    int default_out;
    int i = 0;
    int latency_valid = FALSE;
    int rate_valid = FALSE;
    int device_valid = FALSE;
    int dur_valid = FALSE;
    
    if (sizeof(void *) == 8) 
        printf("Apparently this is a 64-bit machine.\n");
    else if (sizeof(void *) == 4) 
        printf ("Apparently this is a 32-bit machine.\n");
    
    if (argc <= 1) {
        show_usage();
    } else {
        for (i = 1; i < argc; i++) {
            if (strcmp(argv[i], "-h") == 0) {
                show_usage();
            } else if (strcmp(argv[i], "-l") == 0 && (i + 1 < argc)) {
                i = i + 1;
                latency = atoi(argv[i]);
                printf("Latency will be %ld\n", (long) latency);
                latency_valid = TRUE;
            } else if (strcmp(argv[i], "-r") == 0) {
                i = i + 1;
                msgrate = atoi(argv[i]);
                printf("Rate will be %d messages/second\n", msgrate);
                rate_valid = TRUE;
            } else if (strcmp(argv[i], "-s") == 0) {
                i = i + 1;
                duration = atoi(argv[i]);
                printf("Duration will be %d seconds\n", msgrate);
                dur_valid = TRUE;
            } else if (strcmp(argv[i], "-n") == 0) {
                printf("Sending expired timestamps (-n)\n");
                expired_timestamps = TRUE;
            } else {
                show_usage();
            }
        }
    }

    if (!latency_valid) {
        // coerce to known size
        latency = (int32_t) get_number("Latency in ms: "); 
    }

    if (!rate_valid) {
        // coerce from "%d" to known size
        msgrate = (int32_t) get_number("Rate in messages per second: ");
    }

    if (!dur_valid) {
        duration = get_number("Duration in seconds: ");
    }

    /* list device information */
    default_in = Pm_GetDefaultInputDeviceID();
    default_out = Pm_GetDefaultOutputDeviceID();
    for (i = 0; i < Pm_CountDevices(); i++) {
        char *deflt;
        const PmDeviceInfo *info = Pm_GetDeviceInfo(i);
        if (info->output) {
            printf("%d: %s, %s", i, info->interf, info->name);
            deflt = (i == deviceno ? "selected " :
                      (i == default_out ? "default " : ""));
            printf(" (%soutput)", deflt);
            printf("\n");
        }
    }
    
    if (!device_valid) {
        deviceno = get_number("Output device number: ");
    }

    fast_test();
    return 0;
}